

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int session_call_on_begin_headers(nghttp2_session *session,nghttp2_frame *frame)

{
  nghttp2_on_begin_headers_callback p_Var1;
  int iVar2;
  int iVar3;
  
  p_Var1 = (session->callbacks).on_begin_headers_callback;
  if (p_Var1 != (nghttp2_on_begin_headers_callback)0x0) {
    iVar2 = (*p_Var1)(session,frame,session->user_data);
    iVar3 = -0x386;
    if (iVar2 == 0) {
      iVar3 = iVar2;
    }
    if (iVar2 == -0x209) {
      iVar3 = iVar2;
    }
    return iVar3;
  }
  return 0;
}

Assistant:

static int session_call_on_begin_headers(nghttp2_session *session,
                                         nghttp2_frame *frame) {
  int rv;
  DEBUGF("recv: call on_begin_headers callback stream_id=%d\n",
         frame->hd.stream_id);
  if (session->callbacks.on_begin_headers_callback) {
    rv = session->callbacks.on_begin_headers_callback(session, frame,
                                                      session->user_data);
    if (rv == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE) {
      return rv;
    }
    if (rv != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
  return 0;
}